

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

bool cppwinrt::has_fastabi(TypeDef *type)

{
  bool local_31;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  TypeDef *local_10;
  TypeDef *type_local;
  
  local_31 = false;
  if ((settings[0x1d0] & 1) != 0) {
    local_10 = type;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_20,"Windows.Foundation.Metadata");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"FastAbiAttribute");
    local_31 = has_attribute<winmd::reader::TypeDef>(type,&local_20,&local_30);
  }
  return local_31;
}

Assistant:

static bool has_fastabi(TypeDef const& type)
    {
        return settings.fastabi&& has_attribute(type, "Windows.Foundation.Metadata", "FastAbiAttribute");
    }